

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_SetRootProperty<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  bool bVar1;
  PropertyId pid;
  Var aValue;
  RecyclableObject *instance;
  ConstructorCache *pCVar2;
  InlineCache *local_30;
  InlineCache *inlineCache;
  
  aValue = GetRootObject(this);
  pid = FunctionBody::GetPropertyIdFromCacheId
                  (*(FunctionBody **)(this + 0x88),playout->inlineCacheIndex);
  bVar1 = VarIs<Js::RecyclableObject>(aValue);
  if (bVar1) {
    instance = UnsafeVarTo<Js::RecyclableObject>(aValue);
    bVar1 = TrySetPropertyLocalFastPath<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
                      (this,playout,pid,instance,&local_30,PropertyOperation_Root);
    if (bVar1) {
      pCVar2 = JavascriptFunction::GetConstructorCache(*(JavascriptFunction **)(this + 0x80));
      if ((pCVar2->content).updateAfterCtor != true) {
        return;
      }
      InlineCache::RemoveFromInvalidationListAndClear
                (local_30,*(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8));
      return;
    }
  }
  DoSetProperty_NoFastPath<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
            (this,playout,aValue,PropertyOperation_Root);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetRootProperty(unaligned T* playout)
    {
        DoSetProperty(playout, this->GetRootObject(), PropertyOperation_Root);
    }